

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http-test.c++:3362:13),_kj::_::PropagateException>
::getImpl(TransformPromiseNode<kj::Promise<kj::Own<kj::AsyncIoStream>_>,_kj::Own<kj::NetworkAddress>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_compat_http_test_c__:3362:13),_kj::_::PropagateException>
          *this,ExceptionOrValue *output)

{
  ExceptionOr<kj::Own<kj::NetworkAddress>_> *addr;
  ExceptionOr<kj::Own<kj::NetworkAddress>_> depResult;
  Exception local_5b8;
  ExceptionOr<kj::Own<kj::NetworkAddress>_> local_458;
  ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> local_2e8;
  Exception local_170;
  
  addr = &local_458;
  local_458.super_ExceptionOrValue.exception.ptr.isSet = false;
  local_458.value.ptr.disposer = (Disposer *)0x0;
  local_458.value.ptr.ptr = (NetworkAddress *)0x0;
  TransformPromiseNodeBase::getDepResult
            (&this->super_TransformPromiseNodeBase,&addr->super_ExceptionOrValue);
  if (local_458.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::Exception(&local_5b8,&local_458.super_ExceptionOrValue.exception.ptr.field_1.value);
    local_170.ownFile.content.ptr = local_5b8.ownFile.content.ptr;
    local_170.ownFile.content.size_ = local_5b8.ownFile.content.size_;
    local_170.ownFile.content.disposer = local_5b8.ownFile.content.disposer;
    local_5b8.ownFile.content.ptr = (char *)0x0;
    local_5b8.ownFile.content.size_ = 0;
    local_170.file = local_5b8.file;
    local_170.line = local_5b8.line;
    local_170.type = local_5b8.type;
    local_170.description.content.ptr = local_5b8.description.content.ptr;
    local_170.description.content.size_ = local_5b8.description.content.size_;
    local_5b8.description.content.ptr = (char *)0x0;
    local_5b8.description.content.size_ = 0;
    local_170.description.content.disposer = local_5b8.description.content.disposer;
    local_170.context.ptr.disposer = local_5b8.context.ptr.disposer;
    local_170.context.ptr.ptr = local_5b8.context.ptr.ptr;
    local_5b8.context.ptr.ptr = (Context *)0x0;
    memcpy(local_170.trace,local_5b8.trace,0x104);
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&local_2e8,&local_170);
    local_2e8.value.ptr.isSet = false;
    Exception::~Exception(&local_170);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *)output,&local_2e8);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr(&local_2e8);
    Exception::~Exception(&local_5b8);
  }
  else if (local_458.value.ptr.ptr != (NetworkAddress *)0x0) {
    local_170.ownFile.content.ptr = (char *)local_458.value.ptr.disposer;
    local_170.ownFile.content.size_ = (size_t)local_458.value.ptr.ptr;
    local_458.value.ptr.ptr = (NetworkAddress *)0x0;
    anon_class_1_0_00000001_for_func::operator()
              ((anon_class_1_0_00000001_for_func *)&local_5b8,(Own<kj::NetworkAddress> *)addr);
    Own<kj::NetworkAddress>::dispose((Own<kj::NetworkAddress> *)&local_170);
    local_2e8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_2e8.value.ptr.isSet = true;
    local_2e8.value.ptr.field_1.value.super_PromiseBase.node.disposer =
         (Disposer *)local_5b8.ownFile.content.ptr;
    local_2e8.value.ptr.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)local_5b8.ownFile.content.size_;
    local_5b8.ownFile.content.size_ = 0;
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_> *)output,&local_2e8);
    ExceptionOr<kj::Promise<kj::Own<kj::AsyncIoStream>_>_>::~ExceptionOr(&local_2e8);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&local_5b8);
  }
  ExceptionOr<kj::Own<kj::NetworkAddress>_>::~ExceptionOr(&local_458);
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_MAYBE(depException, depResult.exception) {
      output.as<T>() = handle(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(*depException)));
    } else KJ_IF_MAYBE(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(*depValue)));
    }
  }